

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

double add_regularization<dense_parameters>
                 (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  uint32_t uVar1;
  float *pfVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  float *pfVar8;
  weight *pwVar9;
  double dVar10;
  float fVar11;
  double dVar12;
  
  pwVar9 = b->regularizers;
  pfVar2 = weights->_begin;
  if (pwVar9 == (weight *)0x0) {
    uVar6 = weights->_weight_mask;
    if (pfVar2 != pfVar2 + uVar6 + 1) {
      uVar1 = weights->_stride_shift;
      dVar10 = 0.0;
      do {
        pfVar2[1] = regularization * *pfVar2 + pfVar2[1];
        dVar12 = (double)*pfVar2;
        dVar10 = dVar10 + (double)regularization * 0.5 * dVar12 * dVar12;
        pfVar8 = weights->_begin;
        uVar6 = weights->_weight_mask;
        pfVar2 = pfVar2 + (1L << ((byte)uVar1 & 0x3f));
      } while (pfVar2 != pfVar8 + uVar6 + 1);
      goto LAB_001a824e;
    }
  }
  else {
    uVar6 = weights->_weight_mask;
    if (pfVar2 != pfVar2 + uVar6 + 1) {
      uVar1 = weights->_stride_shift;
      dVar10 = 0.0;
      lVar4 = 0;
      do {
        uVar5 = (ulong)(lVar4 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
        fVar11 = *(float *)((long)pfVar2 + lVar4) - pwVar9[uVar5 * 2 + 1];
        *(float *)((long)pfVar2 + lVar4 + 4) =
             pwVar9[uVar5 * 2] * fVar11 + *(float *)((long)pfVar2 + lVar4 + 4);
        pwVar9 = b->regularizers;
        dVar12 = (double)fVar11;
        dVar10 = dVar10 + (double)pwVar9[uVar5 * 2] * 0.5 * dVar12 * dVar12;
        pfVar8 = weights->_begin;
        uVar6 = weights->_weight_mask;
        lVar4 = lVar4 + (1L << ((byte)uVar1 & 0x3f)) * 4;
      } while ((float *)((long)pfVar2 + lVar4) != pfVar8 + uVar6 + 1);
      goto LAB_001a824e;
    }
  }
  dVar10 = 0.0;
  pfVar8 = pfVar2;
LAB_001a824e:
  if (all->no_bias == true) {
    pwVar9 = b->regularizers;
    bVar3 = (byte)weights->_stride_shift;
    if (pwVar9 == (weight *)0x0) {
      uVar5 = uVar6 & 0xb1c55cL << (bVar3 & 0x3f);
      pfVar8[uVar5 + 1] = pfVar8[uVar5 + 1] - regularization * pfVar8[uVar5];
      dVar10 = (double)regularization * -0.5 *
               (double)weights->_begin
                       [0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask]
               * (double)weights->_begin
                         [0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask
                         ] + dVar10;
    }
    else {
      uVar7 = uVar6 & 0xb1c55cL << (bVar3 & 0x3f);
      uVar5 = (ulong)(uint)((int)(0xb1c55cL >> (bVar3 & 0x3f)) << 3);
      fVar11 = pfVar8[uVar7] - *(float *)((long)pwVar9 + uVar5 + 4);
      pfVar8[uVar7 + 1] = pfVar8[uVar7 + 1] - *(float *)((long)pwVar9 + uVar5) * fVar11;
      dVar12 = (double)fVar11;
      dVar10 = (double)*(float *)((long)b->regularizers + uVar5) * -0.5 * dVar12 * dVar12 + dVar10;
    }
  }
  return dVar10;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}